

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::file_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::file_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<float> *original_costs,
            double cost_constant)

{
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *this_00;
  float *pfVar1;
  init_policy_type iVar2;
  context *ctx;
  context *ctx_00;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  void *pvVar7;
  unique_ptr<float[],_std::default_delete<float[]>_> P;
  unique_ptr<float[],_std::default_delete<float[]>_> uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  rep rVar12;
  long lVar13;
  ulong uVar14;
  random_engine *rng;
  int iVar15;
  long lVar16;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  undefined1 auVar17 [16];
  float delta;
  float fVar19;
  double dVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  double dVar20;
  undefined1 auVar24 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar25 [16];
  float theta;
  string_view filename;
  compute_order compute;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  slv;
  file_observer obs;
  bit_array_impl local_4a8;
  result *local_498;
  float local_48c;
  double local_488;
  double local_480;
  default_cost_type<float> *local_478;
  double local_470;
  double local_468;
  double local_460;
  int local_454;
  cost_type local_450;
  double local_440;
  long local_438;
  compute_order local_430;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  local_3f8;
  undefined1 local_288 [8];
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Stack_280;
  filebuf local_278 [240];
  ios_base local_188 [264];
  ap_file_observer local_80;
  undefined1 auVar18 [64];
  undefined1 extraout_var [60];
  
  auVar22 = ZEXT1664(ZEXT816(0) << 0x40);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar22;
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = auVar22;
  __return_storage_ptr__->strings = (string_buffer_ptr)auVar22._0_16_;
  (__return_storage_ptr__->method)._M_len = SUB168(auVar22._16_16_,0);
  (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar22._16_16_,8);
  (__return_storage_ptr__->affected_vars).names =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )auVar22._32_24_;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar22._56_8_;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_498 = __return_storage_ptr__;
  local_470 = cost_constant;
  bit_array_impl::bit_array_impl(&local_4a8,variables);
  ctx = this->m_ctx;
  normalize_costs<float,baryonyx::itm::default_cost_type<float>>
            ((itm *)&local_450,ctx,original_costs,this->m_rng,variables);
  local_480 = (ctx->parameters).kappa_step;
  local_488 = (ctx->parameters).kappa_max;
  local_460 = (ctx->parameters).alpha;
  dVar21 = (ctx->parameters).delta;
  theta = (float)(ctx->parameters).theta;
  if (0.0 <= dVar21) {
    delta = (float)dVar21;
  }
  else {
    ctx_00 = this->m_ctx;
    local_288._0_4_ = theta;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar17 = SUB6416(ZEXT464(0x7f7fffff),0);
    }
    else {
      auVar23 = ZEXT464(0x7f7fffff);
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      uVar14 = 0;
      do {
        pfVar1 = (float *)((long)local_450.linear_elements._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar14 * 4);
        uVar14 = uVar14 + 1;
        auVar17 = vandps_avx(ZEXT416((uint)*pfVar1),auVar25);
        uVar4 = vcmpps_avx512vl(ZEXT416((uint)*pfVar1),ZEXT816(0) << 0x40,4);
        uVar5 = vcmpps_avx512vl(auVar17,auVar23._0_16_,1);
        bVar6 = (byte)uVar4 & (byte)uVar5;
        auVar18._16_48_ = auVar22._16_48_;
        auVar18._0_16_ = auVar23._0_16_;
        auVar22._4_60_ = auVar18._4_60_;
        auVar22._0_4_ = (uint)(bVar6 & 1) * auVar17._0_4_ + (uint)!(bool)(bVar6 & 1) * auVar23._0_4_
        ;
        auVar17 = auVar22._0_16_;
        auVar23 = ZEXT1664(auVar17);
      } while ((uint)variables != uVar14);
    }
    local_3f8.super_debug_logger<false>.ofs._0_4_ = auVar17._0_4_;
    auVar17 = vfnmadd132ss_fma(auVar17,auVar17,ZEXT416((uint)theta));
    local_430.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = auVar17._0_4_;
    info<float,float,float>
              (ctx_00,"    - delta={} (min normalized cost:{} / theta: {})\n",(float *)&local_430,
               (float *)&local_3f8,(float *)local_288);
    delta = local_430.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_;
  }
  local_438 = (long)(ctx->parameters).w;
  local_468 = (ctx->parameters).pushing_k_factor;
  local_440 = (ctx->parameters).pushing_objective_amplifier;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::solver_inequalities_Zcoeff
            (&local_3f8,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_450,constraints);
  compute_order::compute_order(&local_430,(ctx->parameters).order,variables);
  dVar21 = (this->m_ctx->parameters).init_policy_random;
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar2 = (ctx->parameters).init_policy;
  if (iVar2 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>
              ((bit_array *)&local_4a8,original_costs,variables,0);
  }
  else {
    if (iVar2 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_4a8;
      x_optimistic = (bit_array_impl *)local_288;
    }
    else {
      if (iVar2 != optimistic_solve) goto LAB_00505175;
      rng = this->m_rng;
      x_pessimistic = (bit_array_impl *)local_288;
      x_optimistic = &local_4a8;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_00505175:
  local_478 = original_costs;
  if (local_4a8.m_size != 0) {
    iVar15 = 0;
    do {
      dVar20 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar20 < dVar21) {
        bit_array_impl::invert(&local_4a8,iVar15);
      }
      iVar15 = iVar15 + 1;
    } while (local_4a8.m_size != iVar15);
  }
  if (_Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)_Stack_280._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  dVar21 = (ctx->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  file_observer::file_observer
            ((file_observer *)local_288,filename,local_3f8.m,local_3f8.n,(ctx->parameters).limit);
  rVar12 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar12;
  rVar12 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar12;
  compute_order::
  init<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array>
            (&local_430,&local_3f8,(bit_array *)&local_4a8);
  local_454 = variables;
  if ((ctx->parameters).limit != 0) {
    local_48c = (float)local_480;
    iVar15 = 0x7fffffff;
    lVar16 = 0;
    local_480 = (double)CONCAT44(local_480._4_4_,(float)local_488);
    local_488 = (double)CONCAT44(local_488._4_4_,(float)local_460);
    local_460 = (double)CONCAT44(local_460._4_4_,(float)local_468);
    local_468 = (double)CONCAT44(local_468._4_4_,(float)local_440);
    fVar19 = (float)dVar21;
    while( true ) {
      iVar9 = compute_order::
              run<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                        (&local_430,&local_3f8,(bit_array *)&local_4a8,this->m_rng,fVar19,delta,
                         theta);
      uVar8._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)local_3f8.pi;
      P._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)local_3f8.P;
      details::pi_file_observer::make_observation<float>
                ((pi_file_observer *)local_288,&local_3f8.ap,
                 (float *)local_3f8.P._M_t.
                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl,
                 (float *)local_3f8.pi._M_t.
                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl);
      details::ap_file_observer::make_observation<float>
                (&local_80,&local_3f8.ap,
                 (float *)P._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl,
                 (float *)uVar8._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                          _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl);
      if (iVar9 == 0) {
        dVar21 = default_cost_type<float>::results(local_478,(bit_array *)&local_4a8,local_470);
        store_if_better(this,(bit_array *)&local_4a8,dVar21,lVar16);
        auVar22 = ZEXT464((uint)fVar19);
        if ((ctx->parameters).pushes_limit < 1) goto LAB_005053d3;
        iVar15 = 0;
        iVar9 = 0;
        goto LAB_00505566;
      }
      if (iVar9 < iVar15) {
        store_if_better(this,(bit_array *)&local_4a8,iVar9,lVar16);
        iVar15 = iVar9;
      }
      if (local_438 < lVar16) {
        auVar24._0_4_ = powf((float)iVar9 / (float)local_3f8.m,local_488._0_4_);
        auVar24._4_60_ = extraout_var;
        auVar17 = vfmadd231ss_fma(ZEXT416((uint)fVar19),auVar24._0_16_,ZEXT416((uint)local_48c));
        fVar19 = auVar17._0_4_;
      }
      if (local_480._0_4_ < fVar19) break;
      lVar13 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar13;
      dVar21 = (this->m_ctx->parameters).time_limit;
      if (((0.0 < dVar21) && (dVar21 < (double)(lVar13 - (this->m_begin).__d.__r) / 1000000000.0))
         || (lVar16 = lVar16 + 1, lVar16 == (ctx->parameters).limit)) break;
    }
  }
  local_498->status = limit_reached;
LAB_005053d3:
  iVar15 = local_454;
  if ((this->m_best).remaining_constraints == 0) {
    local_498->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    this_00 = &local_498->solutions;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(this_00,1);
    convert<baryonyx::itm::maximize_tag>
              (&this->m_best,
               (this_00->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
               )._M_impl.super__Vector_impl_data._M_start,iVar15);
  }
  if (local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_basename._M_dataplus._M_p != &local_80.m_basename.field_2) {
    operator_delete(local_80.m_basename._M_dataplus._M_p,
                    local_80.m_basename.field_2._M_allocated_capacity + 1);
  }
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_VTT;
  *(undefined8 *)(local_278 + _VTT[-3] + -8) = _log;
  std::filebuf::~filebuf(local_278);
  std::ios_base::~ios_base(local_188);
  if (local_430.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_430.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar7 = (void *)CONCAT44(local_430.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_430.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,(long)local_430.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar7);
  }
  solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::~solver_inequalities_Zcoeff(&local_3f8);
  if ((__uniq_ptr_impl<float,_std::default_delete<float[]>_>)
      local_450.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_450.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      local_4a8.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_4a8.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return local_498;
LAB_00505566:
  do {
    iVar10 = compute_order::
             push_and_run<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                       (&local_430,&local_3f8,(bit_array *)&local_4a8,this->m_rng,
                        auVar22._0_4_ * local_460._0_4_,delta,theta,local_468._0_4_);
    if (iVar10 == 0) {
      dVar21 = default_cost_type<float>::results(local_478,(bit_array *)&local_4a8,local_470);
      store_if_better(this,(bit_array *)&local_4a8,dVar21,
                      (long)~((ctx->parameters).pushing_iteration_limit * iVar9));
    }
    lVar16 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar16;
    auVar22 = ZEXT464((uint)auVar22._0_4_);
    dVar21 = (this->m_ctx->parameters).time_limit;
    if ((0.0 < dVar21) && (dVar21 < (double)(lVar16 - (this->m_begin).__d.__r) / 1000000000.0))
    break;
    if (0 < (ctx->parameters).pushing_iteration_limit) {
      iVar10 = 1;
      do {
        fVar19 = auVar22._0_4_;
        iVar11 = compute_order::
                 run<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                           (&local_430,&local_3f8,(bit_array *)&local_4a8,this->m_rng,fVar19,delta,
                            theta);
        if (iVar11 == 0) {
          dVar21 = default_cost_type<float>::results(local_478,(bit_array *)&local_4a8,local_470);
          store_if_better(this,(bit_array *)&local_4a8,dVar21,
                          (long)((ctx->parameters).pushing_iteration_limit * iVar15 - iVar10));
          auVar22 = ZEXT464((uint)fVar19);
          break;
        }
        if ((double)(iVar10 + -1) <= (ctx->parameters).w) {
          auVar22 = ZEXT464((uint)fVar19);
        }
        else {
          auVar23._0_4_ = powf((float)iVar11 / (float)local_3f8.m,local_488._0_4_);
          auVar23._4_60_ = extraout_var_00;
          auVar17 = vfmadd231ss_fma(ZEXT416((uint)fVar19),auVar23._0_16_,ZEXT416((uint)local_48c));
          auVar22 = ZEXT1664(auVar17);
        }
        fVar19 = auVar22._0_4_;
        if (local_480._0_4_ < fVar19) break;
        lVar16 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar16;
        dVar21 = (this->m_ctx->parameters).time_limit;
        if ((0.0 < dVar21) && (dVar21 < (double)(lVar16 - (this->m_begin).__d.__r) / 1000000000.0))
        {
          auVar22 = ZEXT464((uint)fVar19);
          break;
        }
        auVar22 = ZEXT464((uint)fVar19);
        bVar3 = iVar10 < (ctx->parameters).pushing_iteration_limit;
        iVar10 = iVar10 + 1;
      } while (bVar3);
    }
    iVar9 = iVar9 + 1;
    iVar15 = iVar15 + -1;
  } while (iVar9 < (ctx->parameters).pushes_limit);
  goto LAB_005053d3;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }